

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O2

void __thiscall DFsVariable::Serialize(DFsVariable *this,FSerializer *ar)

{
  FSerializer *pFVar1;
  
  DObject::Serialize(&this->super_DObject,ar);
  pFVar1 = FSerializer::operator()(ar,"name",&this->Name);
  pFVar1 = FSerializer::operator()(pFVar1,"type",&this->type);
  pFVar1 = FSerializer::operator()(pFVar1,"string",&this->string);
  pFVar1 = FSerializer::operator()(pFVar1,"actor",&this->actor);
  pFVar1 = FSerializer::operator()(pFVar1,"value",&(this->value).i);
  FSerializer::operator()(pFVar1,"next",&this->next);
  return;
}

Assistant:

void DFsVariable::Serialize(FSerializer & ar)
{
	Super::Serialize(ar);
	ar("name", Name)
		("type", type)
		("string", string)
		("actor", actor)
		("value", value.i)
		("next", next);
}